

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FeatureSet * __thiscall google::protobuf::Symbol::features(Symbol *this)

{
  uint8_t uVar1;
  SymbolBase *pSVar2;
  SymbolBase *pSVar3;
  bool bVar4;
  
  pSVar2 = this->ptr_;
  uVar1 = pSVar2->symbol_type_;
  switch(uVar1) {
  case '\x01':
    pSVar3 = (SymbolBase *)0x0;
    if (uVar1 == '\x01') {
      pSVar3 = pSVar2;
    }
    pSVar3 = pSVar3 + 0x38;
    break;
  case '\x02':
    bVar4 = uVar1 == '\x02';
    goto LAB_0023f8bd;
  case '\x03':
    bVar4 = uVar1 == '\x03';
    goto LAB_0023f887;
  case '\x04':
    pSVar3 = (SymbolBase *)0x0;
    if (uVar1 == '\x04') {
      pSVar3 = pSVar2;
    }
    pSVar3 = pSVar3 + 0x30;
    break;
  case '\x05':
    pSVar3 = pSVar2 + (0x28 - (ulong)(uVar1 != '\x05'));
    break;
  default:
    features();
  case '\a':
    bVar4 = uVar1 == '\a';
LAB_0023f887:
    pSVar3 = (SymbolBase *)0x0;
    if (bVar4) {
      pSVar3 = pSVar2;
    }
    pSVar3 = pSVar3 + 0x28;
    break;
  case '\b':
    bVar4 = uVar1 == '\b';
LAB_0023f8bd:
    pSVar3 = (SymbolBase *)0x0;
    if (bVar4) {
      pSVar3 = pSVar2;
    }
    pSVar3 = pSVar3 + 0x48;
    break;
  case '\t':
    pSVar3 = (SymbolBase *)0x0;
    if (uVar1 == '\t') {
      pSVar3 = pSVar2;
    }
    pSVar3 = pSVar3 + 0x90;
  }
  return *(FeatureSet **)pSVar3;
}

Assistant:

Type type() const { return static_cast<Type>(ptr_->symbol_type_); }